

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

Matcher<const_unsigned_short_&> *
testing::internal::MatcherCastImpl<const_unsigned_short_&,_int>::CastImpl<true>
          (Matcher<const_unsigned_short_&> *__return_storage_ptr__,
          undefined4 *polymorphic_matcher_or_value)

{
  unsigned_short local_22;
  undefined4 *local_20;
  int *polymorphic_matcher_or_value_local;
  Matcher<const_unsigned_short_&> *local_10;
  
  local_22 = (unsigned_short)*polymorphic_matcher_or_value;
  local_20 = polymorphic_matcher_or_value;
  local_10 = __return_storage_ptr__;
  Matcher<const_unsigned_short_&>::Matcher(__return_storage_ptr__,&local_22);
  return __return_storage_ptr__;
}

Assistant:

static Matcher<T> CastImpl(const M& polymorphic_matcher_or_value,
                             std::true_type /* convertible_to_matcher */,
                             std::integral_constant<bool, Ignore>) {
    // M is implicitly convertible to Matcher<T>, which means that either
    // M is a polymorphic matcher or Matcher<T> has an implicit constructor
    // from M.  In both cases using the implicit conversion will produce a
    // matcher.
    //
    // Even if T has an implicit constructor from M, it won't be called because
    // creating Matcher<T> would require a chain of two user-defined conversions
    // (first to create T from M and then to create Matcher<T> from T).
    return polymorphic_matcher_or_value;
  }